

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O0

void __thiscall FTeam::FTeam(FTeam *this)

{
  FTeam *this_local;
  
  FString::FString(&this->m_Name);
  FString::FString(&this->m_TextColor);
  FString::FString(&this->m_Logo);
  this->m_iPlayerColor = 0;
  this->m_iPlayerCount = 0;
  this->m_iScore = 0;
  this->m_iPresent = 0;
  this->m_iTies = 0;
  this->m_bAllowCustomPlayerColor = false;
  return;
}

Assistant:

FTeam::FTeam ()
{
	m_iPlayerColor = 0;
	m_iPlayerCount = 0;
	m_iScore = 0;
	m_iPresent = 0;
	m_iTies = 0;
	m_bAllowCustomPlayerColor = false;
}